

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tcp_connection.cc
# Opt level: O3

void __thiscall AliTcpConnection::AliTcpConnection(AliTcpConnection *this,string *host,int port)

{
  pointer pcVar1;
  
  (this->super_AliConnection)._vptr_AliConnection = (_func_int **)&PTR_Connect_00247af8;
  this->fd_ = 0;
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  pcVar1 = (host->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host_,pcVar1,pcVar1 + host->_M_string_length);
  this->port_ = port;
  return;
}

Assistant:

AliTcpConnection::AliTcpConnection(std::string host, int port) :
                                    fd_(0),
                                    host_(host),
                                    port_(port) {
}